

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O3

void __thiscall
wabt::OptionParser::AddOption
          (OptionParser *this,char short_name,char *long_name,char *help,NullCallback *callback)

{
  _Manager_type p_Var1;
  Option option;
  allocator local_16a;
  allocator local_169;
  _Any_data local_168;
  _Manager_type local_158;
  _Invoker_type p_Stack_150;
  _Any_data local_140;
  code *local_130;
  code *local_128;
  string local_120;
  string local_100;
  string local_e0;
  Option local_c0;
  
  std::__cxx11::string::string((string *)&local_e0,long_name,&local_169);
  local_100._M_string_length = 0;
  local_100.field_2._M_local_buf[0] = '\0';
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::string((string *)&local_120,help,&local_16a);
  local_158 = (_Manager_type)0x0;
  p_Stack_150 = (_Invoker_type)0x0;
  local_168._M_unused._M_object = (void *)0x0;
  local_168._8_8_ = 0;
  p_Var1 = (callback->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)(&local_168,(_Any_data *)callback,__clone_functor);
    p_Stack_150 = callback->_M_invoker;
    local_158 = (callback->super__Function_base)._M_manager;
  }
  p_Var1 = local_158;
  local_140._8_8_ = 0;
  local_140._M_unused._M_object = operator_new(0x20);
  *(undefined8 *)local_140._M_unused._0_8_ = 0;
  *(char *)((long)local_140._M_unused._0_8_ + 8) = '\0';
  *(char *)((long)local_140._M_unused._0_8_ + 9) = '\0';
  *(char *)((long)local_140._M_unused._0_8_ + 10) = '\0';
  *(char *)((long)local_140._M_unused._0_8_ + 0xb) = '\0';
  *(char *)((long)local_140._M_unused._0_8_ + 0xc) = '\0';
  *(char *)((long)local_140._M_unused._0_8_ + 0xd) = '\0';
  *(char *)((long)local_140._M_unused._0_8_ + 0xe) = '\0';
  *(char *)((long)local_140._M_unused._0_8_ + 0xf) = '\0';
  *(char *)((long)local_140._M_unused._0_8_ + 0x10) = '\0';
  *(char *)((long)local_140._M_unused._0_8_ + 0x11) = '\0';
  *(char *)((long)local_140._M_unused._0_8_ + 0x12) = '\0';
  *(char *)((long)local_140._M_unused._0_8_ + 0x13) = '\0';
  *(char *)((long)local_140._M_unused._0_8_ + 0x14) = '\0';
  *(char *)((long)local_140._M_unused._0_8_ + 0x15) = '\0';
  *(char *)((long)local_140._M_unused._0_8_ + 0x16) = '\0';
  *(char *)((long)local_140._M_unused._0_8_ + 0x17) = '\0';
  *(char *)((long)local_140._M_unused._0_8_ + 0x18) = '\0';
  *(char *)((long)local_140._M_unused._0_8_ + 0x19) = '\0';
  *(char *)((long)local_140._M_unused._0_8_ + 0x1a) = '\0';
  *(char *)((long)local_140._M_unused._0_8_ + 0x1b) = '\0';
  *(char *)((long)local_140._M_unused._0_8_ + 0x1c) = '\0';
  *(char *)((long)local_140._M_unused._0_8_ + 0x1d) = '\0';
  *(char *)((long)local_140._M_unused._0_8_ + 0x1e) = '\0';
  *(char *)((long)local_140._M_unused._0_8_ + 0x1f) = '\0';
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)local_140._M_unused._0_8_,&local_168,__clone_functor);
    *(_Manager_type *)((long)local_140._M_unused._0_8_ + 0x10) = local_158;
    *(_Invoker_type *)((long)local_140._M_unused._0_8_ + 0x18) = p_Stack_150;
  }
  local_128 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/option-parser.cc:80:17)>
              ::_M_invoke;
  local_130 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/option-parser.cc:80:17)>
              ::_M_manager;
  Option::Option(&local_c0,short_name,&local_e0,&local_100,No,&local_120,(Callback *)&local_140);
  if (local_130 != (code *)0x0) {
    (*local_130)(&local_140,&local_140,__destroy_functor);
  }
  if (local_158 != (_Manager_type)0x0) {
    (*local_158)(&local_168,&local_168,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  std::vector<wabt::OptionParser::Option,std::allocator<wabt::OptionParser::Option>>::
  emplace_back<wabt::OptionParser::Option_const&>
            ((vector<wabt::OptionParser::Option,std::allocator<wabt::OptionParser::Option>> *)
             &this->options_,&local_c0);
  if (local_c0.callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_c0.callback.super__Function_base._M_manager)
              ((_Any_data *)&local_c0.callback,(_Any_data *)&local_c0.callback,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.help._M_dataplus._M_p != &local_c0.help.field_2) {
    operator_delete(local_c0.help._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.metavar._M_dataplus._M_p != &local_c0.metavar.field_2) {
    operator_delete(local_c0.metavar._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.long_name._M_dataplus._M_p != &local_c0.long_name.field_2) {
    operator_delete(local_c0.long_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void OptionParser::AddOption(char short_name,
                             const char* long_name,
                             const char* help,
                             const NullCallback& callback) {
  Option option(short_name, long_name, std::string(), HasArgument::No, help,
                [callback](const char*) { callback(); });
  AddOption(option);
}